

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_UnsupportedECHConfig_Test::TestBody
          (SSLTest_UnsupportedECHConfig_Test *this)

{
  undefined1 *puVar1;
  bool bVar2;
  allocator_type aVar3;
  int iVar4;
  EVP_HPKE_KEM *kem;
  pointer *__ptr_8;
  char *in_R9;
  pointer *__ptr;
  initializer_list<unsigned_short> __l;
  initializer_list<unsigned_short> __l_00;
  initializer_list<unsigned_short> __l_01;
  initializer_list<unsigned_short> __l_02;
  initializer_list<unsigned_short> __l_03;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__8;
  UniquePtr<SSL_ECH_KEYS> keys;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ech_config;
  ECHConfigParams invalid_public_name;
  ECHConfigParams extensions;
  ECHConfigParams unsupported_aead;
  ECHConfigParams unsupported_kdf;
  ECHConfigParams unsupported_version;
  ScopedEVP_HPKE_KEY key;
  AssertHelper local_3b0;
  AssertHelper local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  undefined1 local_398 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  AssertHelper local_378;
  _Head_base<0UL,_ssl_ech_keys_st_*,_false> local_370;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_368;
  undefined1 local_348 [8];
  _Alloc_hider local_340;
  undefined1 local_338 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  pointer local_310;
  pointer puStack_308;
  pointer local_300;
  size_t local_2f8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_2f0;
  pointer local_2d8;
  pointer puStack_2d0;
  pointer local_2c8;
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  undefined1 local_2b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  pointer local_288;
  pointer puStack_280;
  pointer local_278;
  size_t local_270;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_268;
  pointer local_250;
  pointer puStack_248;
  pointer local_240;
  undefined1 local_238 [8];
  _Alloc_hider local_230;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  pointer local_200;
  pointer puStack_1f8;
  pointer local_1f0;
  size_t local_1e8;
  pointer local_1e0 [2];
  pointer local_1d0;
  pointer local_1c8;
  pointer puStack_1c0;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  pointer local_178;
  pointer puStack_170;
  pointer local_168;
  size_t local_160;
  pointer local_158 [2];
  pointer local_148;
  pointer local_140;
  pointer puStack_138;
  pointer local_130;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  EVP_HPKE_KEY *local_100;
  uint16_t local_f8;
  pointer local_f0;
  pointer puStack_e8;
  pointer local_e0;
  size_t local_d8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_d0;
  pointer local_b8;
  pointer puStack_b0;
  pointer local_a8;
  EVP_HPKE_KEY local_a0;
  
  local_370._M_head_impl = SSL_ECH_KEYS_new();
  local_1b0[0] = local_370._M_head_impl != (SSL_ECH_KEYS *)0x0;
  local_1a8._M_p = (pointer)0x0;
  if (local_370._M_head_impl == (SSL_ECH_KEYS *)0x0) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_1b0,(AssertionResult *)0x3467d1,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x81c,(char *)CONCAT44(local_128._4_4_,CONCAT22(local_128._2_2_,local_128._0_2_)));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c0,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c0);
    puVar1 = (undefined1 *)CONCAT44(local_128._4_4_,CONCAT22(local_128._2_2_,local_128._0_2_));
    if (puVar1 != local_128 + 0x10) {
      operator_delete(puVar1,local_128._16_8_ + 1);
    }
    if ((long *)CONCAT44(local_238._4_4_,local_238._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_238._4_4_,local_238._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1a8._M_p);
    }
    goto LAB_00167e42;
  }
  EVP_HPKE_KEY_zero(&local_a0);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar4 = EVP_HPKE_KEY_generate(&local_a0,kem);
  local_1b0[0] = iVar4 != 0;
  local_1a8._M_p = (pointer)0x0;
  if (iVar4 == 0) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)local_1b0,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x81e,(char *)CONCAT44(local_128._4_4_,CONCAT22(local_128._2_2_,local_128._0_2_)));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2c0,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2c0);
    puVar1 = (undefined1 *)CONCAT44(local_128._4_4_,CONCAT22(local_128._2_2_,local_128._0_2_));
    if (puVar1 != local_128 + 0x10) {
      operator_delete(puVar1,local_128._16_8_ + 1);
    }
    if ((long *)CONCAT44(local_238._4_4_,local_238._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_238._4_4_,local_238._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1a8._M_p);
    }
  }
  else {
    local_128._0_2_ = 0xfe0d;
    local_128._2_2_ = 1;
    local_110._M_allocated_capacity._0_7_ = 0x656c706d617865;
    local_110._7_4_ = 0x6d6f632e;
    local_128._16_8_ = 0xb;
    local_110._M_local_buf[0xb] = '\0';
    local_100 = (EVP_HPKE_KEY *)0x0;
    local_f8 = 0;
    local_f0 = (pointer)0x0;
    puStack_e8 = (pointer)0x0;
    local_e0 = (pointer)0x0;
    local_d8 = 0x10;
    local_1b0._0_2_ = 1;
    local_1b0._2_2_ = 1;
    __l._M_len = 2;
    __l._M_array = (iterator)local_1b0;
    local_128._8_8_ = &local_110;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&local_d0,__l,(allocator_type *)local_238);
    local_b8 = (pointer)0x0;
    puStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    local_128._0_2_ = 0xffff;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100 = &local_a0;
    bVar2 = MakeECHConfig(&local_368,(ECHConfigParams *)local_128);
    local_238[0] = bVar2;
    local_230._M_p = (pointer)0x0;
    if (bVar2) {
LAB_00166f24:
      iVar4 = SSL_ECH_KEYS_add(local_370._M_head_impl,1,
                               local_368.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_368.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_368.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_a0);
      local_238[0] = iVar4 == 0;
      local_230._M_p = (pointer)0x0;
      if (iVar4 != 0) {
        testing::Message::Message((Message *)local_2c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1b0,(internal *)local_238,
                   (AssertionResult *)
                   "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x828,(char *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)local_2c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
        if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1a0) {
          operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),
                          (long)local_1a0 + 1);
        }
        if ((long *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_230._M_p);
      }
      local_1b0._0_2_ = 0xfe0d;
      local_1b0._2_2_ = 1;
      local_198._M_dataplus._M_p._0_7_ = 0x656c706d617865;
      local_198._7_4_ = 0x6d6f632e;
      local_1a0 = (undefined1  [8])0xb;
      local_198._M_string_length._3_1_ = '\0';
      local_198.field_2._M_allocated_capacity = 0;
      local_198.field_2._8_2_ = 0;
      local_178 = (pointer)0x0;
      puStack_170 = (pointer)0x0;
      local_168 = (pointer)0x0;
      local_160 = 0x10;
      local_238._0_2_ = 1;
      local_238._2_2_ = 1;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_238;
      local_1a8._M_p = (pointer)&local_198;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_158,__l_00,
                 (allocator_type *)local_2c0);
      local_140 = (pointer)0x0;
      puStack_138 = (pointer)0x0;
      local_130 = (pointer)0x0;
      local_238._0_2_ = 2;
      local_238._2_2_ = 1;
      local_198.field_2._M_allocated_capacity = (size_type)&local_a0;
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_assign_aux<unsigned_short_const*>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)local_158,local_238);
      bVar2 = MakeECHConfig(&local_368,(ECHConfigParams *)local_1b0);
      local_2c0[0] = bVar2;
      local_2b8._M_p = (pointer)0x0;
      if (bVar2) {
LAB_001671dc:
        iVar4 = SSL_ECH_KEYS_add(local_370._M_head_impl,1,
                                 local_368.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_368.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_368.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&local_a0);
        local_2c0[0] = iVar4 == 0;
        local_2b8._M_p = (pointer)0x0;
        if (iVar4 != 0) {
          testing::Message::Message((Message *)local_348);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_238,(internal *)local_2c0,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                     ,"true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_398,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x832,(char *)CONCAT44(local_238._4_4_,local_238._0_4_));
          testing::internal::AssertHelper::operator=((AssertHelper *)local_398,(Message *)local_348)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_398);
          if ((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_) != local_228) {
            operator_delete((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_),
                            (long)local_228 + 1);
          }
          if ((long *)CONCAT44(local_348._4_4_,local_348._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_348._4_4_,local_348._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8._M_p);
        }
        local_238._0_2_ = 0xfe0d;
        local_238._2_2_ = 1;
        local_220._M_dataplus._M_p._0_7_ = 0x656c706d617865;
        local_220._7_4_ = 0x6d6f632e;
        local_228 = (undefined1  [8])0xb;
        local_220._M_string_length._3_1_ = '\0';
        local_220.field_2._M_allocated_capacity = 0;
        local_220.field_2._8_2_ = 0;
        local_200 = (pointer)0x0;
        puStack_1f8 = (pointer)0x0;
        local_1f0 = (pointer)0x0;
        local_1e8 = 0x10;
        local_2c0._0_2_ = 1;
        local_2c0._2_2_ = 1;
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)local_2c0;
        local_230._M_p = (pointer)&local_220;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_1e0,__l_01,
                   (allocator_type *)local_348);
        local_1c8 = (pointer)0x0;
        puStack_1c0 = (pointer)0x0;
        local_1b8 = (pointer)0x0;
        local_2c0._0_2_ = 1;
        local_2c0._2_2_ = 0xffff;
        local_220.field_2._M_allocated_capacity = (size_type)&local_a0;
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_assign_aux<unsigned_short_const*>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)local_1e0,local_2c0);
        bVar2 = MakeECHConfig(&local_368,(ECHConfigParams *)local_238);
        local_348[0] = bVar2;
        local_340._M_p = (pointer)0x0;
        if (bVar2) {
LAB_0016746a:
          iVar4 = SSL_ECH_KEYS_add(local_370._M_head_impl,1,
                                   local_368.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_368.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_368.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,&local_a0);
          local_348[0] = iVar4 == 0;
          local_340._M_p = (pointer)0x0;
          if (iVar4 != 0) {
            testing::Message::Message((Message *)local_398);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_2c0,(internal *)local_348,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                       ,"true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x839,(char *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_));
            testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_398);
            testing::internal::AssertHelper::~AssertHelper(&local_3a8);
            if ((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != local_2b0) {
              operator_delete((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_),
                              (long)local_2b0 + 1);
            }
            if ((long *)CONCAT44(local_398._4_4_,local_398._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_398._4_4_,local_398._0_4_) + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340._M_p);
          }
          local_2c0._0_2_ = 0xfe0d;
          local_2c0._2_2_ = 1;
          local_2a8._M_dataplus._M_p._0_7_ = 0x656c706d617865;
          local_2a8._7_4_ = 0x6d6f632e;
          local_2b0 = (undefined1  [8])0xb;
          local_2a8._M_string_length._3_1_ = '\0';
          local_2a8.field_2._M_allocated_capacity = 0;
          local_2a8.field_2._8_2_ = 0;
          local_288 = (pointer)0x0;
          puStack_280 = (pointer)0x0;
          local_278 = (pointer)0x0;
          local_270 = 0x10;
          local_348._0_2_ = 1;
          local_348._2_2_ = 1;
          __l_02._M_len = 2;
          __l_02._M_array = (iterator)local_348;
          local_2b8._M_p = (pointer)&local_2a8;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    (&local_268,__l_02,(allocator_type *)local_398);
          local_250 = (pointer)0x0;
          puStack_248 = (pointer)0x0;
          local_240 = (pointer)0x0;
          local_348._0_2_ = 0x100;
          local_348._2_2_ = 0;
          local_2a8.field_2._M_allocated_capacity = (size_type)&local_a0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<unsigned_char_const*>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_250,local_348);
          bVar2 = MakeECHConfig(&local_368,(ECHConfigParams *)local_2c0);
          local_398[0] = bVar2;
          local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar2) {
LAB_001676e4:
            iVar4 = SSL_ECH_KEYS_add(local_370._M_head_impl,1,
                                     local_368.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (long)local_368.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_368.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,&local_a0);
            local_398[0] = iVar4 == 0;
            local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 != 0) {
              testing::Message::Message((Message *)&local_3a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_348,(internal *)local_398,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x843,(char *)CONCAT44(local_348._4_4_,local_348._0_4_));
              testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a8);
              testing::internal::AssertHelper::~AssertHelper(&local_3b0);
              if ((undefined1 *)CONCAT44(local_348._4_4_,local_348._0_4_) != local_338) {
                operator_delete((undefined1 *)CONCAT44(local_348._4_4_,local_348._0_4_),
                                (ulong)((long)local_338 + 1));
              }
              if ((long *)CONCAT71(local_3a8.data_._1_7_,local_3a8.data_._0_1_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_3a8.data_._1_7_,local_3a8.data_._0_1_) + 8))();
              }
            }
            if (local_390 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_390,local_390);
            }
            local_348._0_2_ = 0xfe0d;
            local_348._2_2_ = 1;
            local_330._M_dataplus._M_p._0_7_ = 0x656c706d617865;
            local_330._7_4_ = 0x6d6f632e;
            local_338 = (undefined1  [8])0xb;
            local_330._M_string_length._3_1_ = '\0';
            local_330.field_2._M_allocated_capacity = 0;
            local_330.field_2._8_2_ = 0;
            local_310 = (pointer)0x0;
            puStack_308 = (pointer)0x0;
            local_300 = (pointer)0x0;
            local_2f8 = 0x10;
            local_398._0_4_ = 0x10001;
            __l_03._M_len = 2;
            __l_03._M_array = (iterator)local_398;
            local_340._M_p = (pointer)&local_330;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                      (&local_2f0,__l_03,(allocator_type *)&local_3a8);
            local_2d8 = (pointer)0x0;
            puStack_2d0 = (pointer)0x0;
            local_2c8 = (pointer)0x0;
            local_330.field_2._M_allocated_capacity = (size_type)&local_a0;
            std::__cxx11::string::_M_replace((ulong)&local_340,0,(char *)local_338,0x345109);
            aVar3 = (allocator_type)MakeECHConfig(&local_368,(ECHConfigParams *)local_348);
            local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3a8.data_._0_1_ = aVar3;
            if ((bool)aVar3) {
LAB_0016794b:
              iVar4 = SSL_ECH_KEYS_add(local_370._M_head_impl,1,
                                       local_368.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (long)local_368.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_368.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,&local_a0);
              local_3a8.data_._0_1_ = (allocator_type)(iVar4 == 0);
              local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_3a8.data_._0_1_) {
                testing::Message::Message((Message *)&local_3b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_398,(internal *)&local_3a8,
                           (AssertionResult *)
                           "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                           ,"true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_378,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x84c,(char *)CONCAT44(local_398._4_4_,local_398._0_4_));
                testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_3b0);
                testing::internal::AssertHelper::~AssertHelper(&local_378);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_398._4_4_,local_398._0_4_) != &local_388) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(local_398._4_4_,local_398._0_4_),
                                  local_388._M_allocated_capacity + 1);
                }
                if (local_3b0.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_3b0.data_ + 8))();
                }
              }
              if (local_3a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_3a0,local_3a0);
              }
            }
            else {
              testing::Message::Message((Message *)&local_3b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_398,(internal *)&local_3a8,
                         (AssertionResult *)"MakeECHConfig(&ech_config, invalid_public_name)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x849,(char *)CONCAT44(local_398._4_4_,local_398._0_4_));
              testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_3b0);
              testing::internal::AssertHelper::~AssertHelper(&local_378);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_398._4_4_,local_398._0_4_) != &local_388) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(local_398._4_4_,local_398._0_4_),
                                local_388._M_allocated_capacity + 1);
              }
              if (local_3b0.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_3b0.data_ + 8))();
              }
              if (local_3a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_3a0,local_3a0);
              }
              if ((bool)aVar3) goto LAB_0016794b;
            }
            if (local_2d8 != (pointer)0x0) {
              operator_delete(local_2d8,(long)local_2c8 - (long)local_2d8);
            }
            if (local_2f0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2f0.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2f0.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2f0.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_310 != (pointer)0x0) {
              operator_delete(local_310,(long)local_300 - (long)local_310);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._M_p
                != &local_330) {
              operator_delete(local_340._M_p,
                              CONCAT17(local_330._M_dataplus._M_p._7_1_,
                                       local_330._M_dataplus._M_p._0_7_) + 1);
            }
          }
          else {
            testing::Message::Message((Message *)&local_3a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_348,(internal *)local_398,
                       (AssertionResult *)"MakeECHConfig(&ech_config, extensions)","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x840,(char *)CONCAT44(local_348._4_4_,local_348._0_4_));
            testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a8);
            testing::internal::AssertHelper::~AssertHelper(&local_3b0);
            if ((undefined1 *)CONCAT44(local_348._4_4_,local_348._0_4_) != local_338) {
              operator_delete((undefined1 *)CONCAT44(local_348._4_4_,local_348._0_4_),
                              (ulong)((long)local_338 + 1));
            }
            if ((long *)CONCAT71(local_3a8.data_._1_7_,local_3a8.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_3a8.data_._1_7_,local_3a8.data_._0_1_) + 8))();
            }
            if (local_390 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_390,local_390);
            }
            if (bVar2) goto LAB_001676e4;
          }
          if (local_250 != (pointer)0x0) {
            operator_delete(local_250,(long)local_240 - (long)local_250);
          }
          if (local_268.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_268.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_268.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_268.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_288 != (pointer)0x0) {
            operator_delete(local_288,(long)local_278 - (long)local_288);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._M_p !=
              &local_2a8) {
            operator_delete(local_2b8._M_p,
                            CONCAT17(local_2a8._M_dataplus._M_p._7_1_,
                                     local_2a8._M_dataplus._M_p._0_7_) + 1);
          }
        }
        else {
          testing::Message::Message((Message *)local_398);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2c0,(internal *)local_348,
                     (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_aead)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_3a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x836,(char *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_));
          testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_398);
          testing::internal::AssertHelper::~AssertHelper(&local_3a8);
          if ((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != local_2b0) {
            operator_delete((undefined1 *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_),
                            (long)local_2b0 + 1);
          }
          if ((long *)CONCAT44(local_398._4_4_,local_398._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_398._4_4_,local_398._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340._M_p);
          }
          if (bVar2) goto LAB_0016746a;
        }
        if (local_1c8 != (pointer)0x0) {
          operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
        }
        if (local_1e0[0] != (pointer)0x0) {
          operator_delete(local_1e0[0],(long)local_1d0 - (long)local_1e0[0]);
        }
        if (local_200 != (pointer)0x0) {
          operator_delete(local_200,(long)local_1f0 - (long)local_200);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._M_p !=
            &local_220) {
          operator_delete(local_230._M_p,
                          CONCAT17(local_220._M_dataplus._M_p._7_1_,local_220._M_dataplus._M_p._0_7_
                                  ) + 1);
        }
      }
      else {
        testing::Message::Message((Message *)local_348);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_238,(internal *)local_2c0,
                   (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_kdf)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_398,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x82f,(char *)CONCAT44(local_238._4_4_,local_238._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_398,(Message *)local_348);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_398);
        if ((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_) != local_228) {
          operator_delete((undefined1 *)CONCAT44(local_238._4_4_,local_238._0_4_),
                          (long)local_228 + 1);
        }
        if ((long *)CONCAT44(local_348._4_4_,local_348._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_348._4_4_,local_348._0_4_) + 8))();
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._M_p !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8._M_p);
        }
        if (bVar2) goto LAB_001671dc;
      }
      if (local_140 != (pointer)0x0) {
        operator_delete(local_140,(long)local_130 - (long)local_140);
      }
      if (local_158[0] != (pointer)0x0) {
        operator_delete(local_158[0],(long)local_148 - (long)local_158[0]);
      }
      if (local_178 != (pointer)0x0) {
        operator_delete(local_178,(long)local_168 - (long)local_178);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._M_p !=
          &local_198) {
        operator_delete(local_1a8._M_p,
                        CONCAT17(local_198._M_dataplus._M_p._7_1_,local_198._M_dataplus._M_p._0_7_)
                        + 1);
      }
    }
    else {
      testing::Message::Message((Message *)local_2c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_238,
                 (AssertionResult *)"MakeECHConfig(&ech_config, unsupported_version)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_348,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x825,(char *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)local_2c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
      if ((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_) != local_1a0) {
        operator_delete((undefined1 *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_),(long)local_1a0 + 1)
        ;
      }
      if ((long *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2c0._4_4_,local_2c0._0_4_) + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_230._M_p);
      }
      if (bVar2) goto LAB_00166f24;
    }
    if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_368.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    if (local_d0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0 != (pointer)0x0) {
      operator_delete(local_f0,(long)local_e0 - (long)local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._8_8_ != &local_110) {
      operator_delete((void *)local_128._8_8_,
                      CONCAT17(local_110._M_local_buf[7],local_110._M_allocated_capacity._0_7_) + 1)
      ;
    }
  }
  EVP_HPKE_KEY_cleanup(&local_a0);
LAB_00167e42:
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)&local_370);
  return;
}

Assistant:

TEST(SSLTest, UnsupportedECHConfig) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  // Unsupported versions are rejected.
  ECHConfigParams unsupported_version;
  unsupported_version.version = 0xffff;
  unsupported_version.key = key.get();
  std::vector<uint8_t> ech_config;
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_version));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Unsupported cipher suites are rejected. (We only support HKDF-SHA256.)
  ECHConfigParams unsupported_kdf;
  unsupported_kdf.key = key.get();
  unsupported_kdf.cipher_suites = {0x002 /* HKDF-SHA384 */,
                                   EVP_HPKE_AES_128_GCM};
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_kdf));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
  ECHConfigParams unsupported_aead;
  unsupported_aead.key = key.get();
  unsupported_aead.cipher_suites = {EVP_HPKE_HKDF_SHA256, 0xffff};
  ASSERT_TRUE(MakeECHConfig(&ech_config, unsupported_aead));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));


  // Unsupported extensions are rejected.
  ECHConfigParams extensions;
  extensions.key = key.get();
  extensions.extensions = {0x00, 0x01, 0x00, 0x00};
  ASSERT_TRUE(MakeECHConfig(&ech_config, extensions));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Invalid public names are rejected.
  ECHConfigParams invalid_public_name;
  invalid_public_name.key = key.get();
  invalid_public_name.public_name = "dns_names_have_no_underscores.example";
  ASSERT_TRUE(MakeECHConfig(&ech_config, invalid_public_name));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
}